

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions_1_4.cpp
# Opt level: O0

bool __thiscall QOpenGLFunctions_1_4::initializeOpenGLFunctions(QOpenGLFunctions_1_4 *this)

{
  bool bVar1;
  QAbstractOpenGLFunctions *this_00;
  QOpenGLContext *pQVar2;
  QAbstractOpenGLFunctions *pQVar3;
  QOpenGLVersionFunctionsBackend *pQVar4;
  long in_RDI;
  QOpenGLVersionFunctionsBackend *d;
  QOpenGLContext *context;
  QOpenGLContext *in_stack_ffffffffffffff88;
  Version v;
  QAbstractOpenGLFunctions *in_stack_ffffffffffffff90;
  bool local_1;
  
  bVar1 = QAbstractOpenGLFunctions::isInitialized(in_stack_ffffffffffffff90);
  if (bVar1) {
    local_1 = true;
  }
  else {
    this_00 = (QAbstractOpenGLFunctions *)QOpenGLContext::currentContext();
    pQVar2 = QAbstractOpenGLFunctions::owningContext(in_stack_ffffffffffffff90);
    if ((((pQVar2 != (QOpenGLContext *)0x0) &&
         (pQVar3 = (QAbstractOpenGLFunctions *)
                   QAbstractOpenGLFunctions::owningContext(in_stack_ffffffffffffff90),
         pQVar3 == this_00)) ||
        (pQVar2 = QAbstractOpenGLFunctions::owningContext(in_stack_ffffffffffffff90),
        pQVar2 == (QOpenGLContext *)0x0)) &&
       (bVar1 = isContextCompatible(in_stack_ffffffffffffff88), bVar1)) {
      pQVar3 = this_00;
      QOpenGLFunctions_1_0_CoreBackend::versionStatus();
      v = (Version)((ulong)pQVar3 >> 0x20);
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend
                         ((QOpenGLContext *)in_stack_ffffffffffffff90,v);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x10) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1b95e4);
      QOpenGLFunctions_1_1_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend((QOpenGLContext *)this_00,v);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x18) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1b9623);
      QOpenGLFunctions_1_2_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend((QOpenGLContext *)this_00,v);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x20) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1b9662);
      QOpenGLFunctions_1_3_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend((QOpenGLContext *)this_00,v);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x28) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1b96a1);
      QOpenGLFunctions_1_4_CoreBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend((QOpenGLContext *)this_00,v);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x30) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1b96e0);
      QOpenGLFunctions_1_0_DeprecatedBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend((QOpenGLContext *)this_00,v);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x38) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1b971f);
      QOpenGLFunctions_1_1_DeprecatedBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend((QOpenGLContext *)this_00,v);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x40) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1b975e);
      QOpenGLFunctions_1_2_DeprecatedBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend((QOpenGLContext *)this_00,v);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x48) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1b979d);
      QOpenGLFunctions_1_3_DeprecatedBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend((QOpenGLContext *)this_00,v);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x50) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1b97dc);
      QOpenGLFunctions_1_4_DeprecatedBackend::versionStatus();
      pQVar4 = QAbstractOpenGLFunctionsPrivate::functionsBackend((QOpenGLContext *)this_00,v);
      *(QOpenGLVersionFunctionsBackend **)(in_RDI + 0x58) = pQVar4;
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1b981b);
      QAbstractOpenGLFunctions::initializeOpenGLFunctions(this_00);
      in_stack_ffffffffffffff90 = this_00;
    }
    local_1 = QAbstractOpenGLFunctions::isInitialized(in_stack_ffffffffffffff90);
  }
  return local_1;
}

Assistant:

bool QOpenGLFunctions_1_4::initializeOpenGLFunctions()
{
    if ( isInitialized() )
        return true;

    QOpenGLContext* context = QOpenGLContext::currentContext();

    // If owned by a context object make sure it is current.
    // Also check that current context is capable of resolving all needed functions
    if (((owningContext() && owningContext() == context) || !owningContext())
        && QOpenGLFunctions_1_4::isContextCompatible(context))
    {
        // Associate with private implementation, creating if necessary
        // Function pointers in the backends are resolved at creation time
        QOpenGLVersionFunctionsBackend* d = nullptr;
        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_0_CoreBackend::versionStatus());
        d_1_0_Core = static_cast<QOpenGLFunctions_1_0_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_1_CoreBackend::versionStatus());
        d_1_1_Core = static_cast<QOpenGLFunctions_1_1_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_2_CoreBackend::versionStatus());
        d_1_2_Core = static_cast<QOpenGLFunctions_1_2_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_3_CoreBackend::versionStatus());
        d_1_3_Core = static_cast<QOpenGLFunctions_1_3_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_4_CoreBackend::versionStatus());
        d_1_4_Core = static_cast<QOpenGLFunctions_1_4_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_0_DeprecatedBackend::versionStatus());
        d_1_0_Deprecated = static_cast<QOpenGLFunctions_1_0_DeprecatedBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_1_DeprecatedBackend::versionStatus());
        d_1_1_Deprecated = static_cast<QOpenGLFunctions_1_1_DeprecatedBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_2_DeprecatedBackend::versionStatus());
        d_1_2_Deprecated = static_cast<QOpenGLFunctions_1_2_DeprecatedBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_3_DeprecatedBackend::versionStatus());
        d_1_3_Deprecated = static_cast<QOpenGLFunctions_1_3_DeprecatedBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_4_DeprecatedBackend::versionStatus());
        d_1_4_Deprecated = static_cast<QOpenGLFunctions_1_4_DeprecatedBackend*>(d);
        d->refs.ref();

        QAbstractOpenGLFunctions::initializeOpenGLFunctions();
    }
    return isInitialized();
}